

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall JsonArray_Nested_Test::TestBody(JsonArray_Nested_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_()> *pMVar2;
  TypedExpectation<std::error_code_()> *pTVar3;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  char *message;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  mock_json_callbacks *pmVar4;
  char *in_R9;
  string local_170;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  undefined1 local_108 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  MockSpec<std::error_code_()> local_60;
  WithoutMatchers local_49;
  MockSpec<std::error_code_()> local_48;
  WithoutMatchers local_35 [13];
  MockSpec<std::error_code_()> local_28;
  InSequence local_11;
  JsonArray_Nested_Test *pJStack_10;
  InSequence _;
  JsonArray_Nested_Test *this_local;
  
  pJStack_10 = this;
  testing::InSequence::InSequence(&local_11);
  local_28.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_begin_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_28,local_35,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0xe3,"callbacks_","begin_array ()");
  pmVar4 = (mock_json_callbacks *)0x2;
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,2);
  local_48.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_null_value
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,pmVar4);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_48,&local_49,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0xe4,"callbacks_","null_value ()");
  pmVar4 = (mock_json_callbacks *)0x1;
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  local_60.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_end_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,pmVar4);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_60,(WithoutMatchers *)((long)&p.coordinate_.row + 3),(void *)0x0);
  extensions = 0x1effd7;
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0xe5,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,2);
  testing::InSequence::~InSequence(&local_11);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_108,
             (json *)&(this->super_JsonArray).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             extensions);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_,"[[null]]",8);
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_108,
                       (string *)&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  local_139 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_108);
  local_139 = !local_139;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_138,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xe9,message);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_108);
  return;
}

Assistant:

TEST_F (JsonArray, Nested) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (2);
        EXPECT_CALL (callbacks_, null_value ()).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (2);
    }
    auto p = json::make_parser (proxy_);
    p.input ("[[null]]"s).eof ();
    EXPECT_FALSE (p.has_error ());
}